

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O2

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenerateCreateVectorField
          (KotlinKMPGenerator *this,FieldDef *field,CodeWriter *writer,IDLOptions *options)

{
  size_t sVar1;
  Type *type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params;
  string array_param;
  string return_type;
  string method_name;
  allocator<char> local_101;
  _Any_data local_100;
  code *local_f0;
  code *local_e8;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  BaseType local_80;
  BaseType local_7c;
  Parser *local_78;
  EnumDef *pEStack_70;
  uint16_t local_68;
  
  local_80 = (field->value).type.element;
  local_68 = (field->value).type.fixed_length;
  local_7c = BASE_TYPE_NONE;
  local_78 = (Parser *)(field->value).type.struct_def;
  pEStack_70 = (field->value).type.enum_def;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"create",(allocator<char> *)&stack0xffffffffffffffa0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"vector",(allocator<char> *)local_100._M_pod_data);
  (*(this->namer_).super_Namer._vptr_Namer[2])
            (&stack0xffffffffffffffc0,&this->namer_,&local_a0,field,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  GenerateKotlinOffsetArray_abi_cxx11_(&local_a0,this,(Type *)&stack0xffffffffffffff80);
  std::operator+(&local_c0,"builder: FlatBufferBuilder, vector:",&local_a0);
  GenType_abi_cxx11_((string *)&stack0xffffffffffffffa0,this,&(field->value).type);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_100._M_pod_data,"size",&local_101);
  sVar1 = InlineSize((Type *)&stack0xffffffffffffff80);
  NumToString<unsigned_long>(&local_e0,sVar1);
  CodeWriter::SetValue(writer,(string *)&local_100,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)local_100._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_100._M_pod_data,"align",&local_101);
  sVar1 = InlineAlignment((Type *)&stack0xffffffffffffff80);
  NumToString<unsigned_long>(&local_e0,sVar1);
  CodeWriter::SetValue(writer,(string *)&local_100,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)local_100._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_100._M_pod_data,"root",&local_101);
  GenMethod_abi_cxx11_(&local_e0,(KotlinKMPGenerator *)&stack0xffffffffffffff80,type);
  CodeWriter::SetValue(writer,(string *)&local_100,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)local_100._M_pod_data);
  local_100._8_8_ = 0;
  local_e8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:822:9)>
             ::_M_invoke;
  local_f0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:822:9)>
             ::_M_manager;
  local_100._M_unused._M_object = writer;
  GenerateFun(writer,(string *)&stack0xffffffffffffffc0,&local_c0,(string *)&stack0xffffffffffffffa0
              ,(function<void_()> *)&local_100,options->gen_jvmstatic);
  std::_Function_base::~_Function_base((_Function_base *)&local_100);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

void GenerateCreateVectorField(FieldDef &field, CodeWriter &writer,
                                 const IDLOptions options) const {
    auto vector_type = field.value.type.VectorType();
    auto method_name = namer_.Method("create", field, "vector");
    auto array_param = GenerateKotlinOffsetArray(vector_type);
    auto params = "builder: FlatBufferBuilder, vector:" + array_param;
    auto return_type = GenType(field.value.type);
    writer.SetValue("size", NumToString(InlineSize(vector_type)));
    writer.SetValue("align", NumToString(InlineAlignment(vector_type)));
    writer.SetValue("root", GenMethod(vector_type));

    GenerateFun(
        writer, method_name, params, return_type,
        [&]() {
          writer += "builder.startVector({{size}}, vector.size, {{align}})";
          writer += "for (i in vector.size - 1 downTo 0) {";
          writer.IncrementIdentLevel();
          writer += "builder.add{{root}}(vector[i])";
          writer.DecrementIdentLevel();
          writer += "}";
          writer += "return builder.endVector()";
        },
        options.gen_jvmstatic);
  }